

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absUtil.c
# Opt level: O1

Vec_Int_t * Gia_FlaConvertToGla(Gia_Man_t *p,Vec_Int_t *vFla)

{
  Gia_Obj_t *pGVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  Vec_Int_t *pVVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  
  Gia_ManIncrementTravId(p);
  if (p->nObjs < 1) {
LAB_0061f7ed:
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  if (p->nTravIdsAlloc < 1) {
LAB_0061f7ce:
    __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x261,"void Gia_ObjSetTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
  }
  pGVar1 = p->pObjs;
  piVar3 = p->pTravIds;
  *piVar3 = p->nTravIds;
  pVVar2 = p->vCis;
  uVar7 = (ulong)(uint)pVVar2->nSize;
  if (p->nRegs < pVVar2->nSize) {
    lVar6 = 0;
    do {
      if ((int)uVar7 <= lVar6) goto LAB_0061f7af;
      iVar8 = pVVar2->pArray[lVar6];
      if (((long)iVar8 < 0) || (p->nObjs <= iVar8)) goto LAB_0061f790;
      if (pGVar1 == (Gia_Obj_t *)0x0) break;
      if (p->nTravIdsAlloc <= iVar8) goto LAB_0061f7ce;
      piVar3[iVar8] = p->nTravIds;
      lVar6 = lVar6 + 1;
      uVar7 = (ulong)pVVar2->nSize;
    } while (lVar6 < (long)(uVar7 - (long)p->nRegs));
  }
  uVar7 = (ulong)(uint)p->nRegs;
  if (0 < p->nRegs) {
    lVar6 = 0;
    do {
      uVar7 = (ulong)(uint)(pVVar2->nSize - (int)uVar7) + lVar6;
      iVar8 = (int)uVar7;
      if ((iVar8 < 0) || (pVVar2->nSize <= iVar8)) goto LAB_0061f7af;
      iVar8 = pVVar2->pArray[uVar7 & 0xffffffff];
      if (((long)iVar8 < 0) || (p->nObjs <= iVar8)) goto LAB_0061f790;
      if (pGVar1 == (Gia_Obj_t *)0x0) break;
      if (vFla->nSize <= lVar6) goto LAB_0061f7af;
      if (vFla->pArray[lVar6] == 0) {
        if (p->nObjs <= iVar8) goto LAB_0061f7ed;
        if (p->nTravIdsAlloc <= iVar8) goto LAB_0061f7ce;
        piVar3[iVar8] = p->nTravIds;
      }
      lVar6 = lVar6 + 1;
      uVar7 = (ulong)p->nRegs;
    } while (lVar6 < (long)uVar7);
  }
  iVar8 = p->nObjs;
  pVVar2 = (Vec_Int_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < iVar8 - 1U) {
    iVar5 = iVar8;
  }
  pVVar2->nSize = 0;
  pVVar2->nCap = iVar5;
  if (iVar5 == 0) {
    piVar3 = (int *)0x0;
  }
  else {
    piVar3 = (int *)malloc((long)iVar5 << 2);
  }
  pVVar2->pArray = piVar3;
  pVVar2->nSize = iVar8;
  if (piVar3 != (int *)0x0) {
    memset(piVar3,0,(long)iVar8 << 2);
  }
  if (iVar8 < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  *piVar3 = 1;
  pVVar4 = p->vCos;
  uVar7 = (ulong)(uint)pVVar4->nSize;
  if (p->nRegs < pVVar4->nSize) {
    lVar6 = 0;
    do {
      if ((int)uVar7 <= lVar6) goto LAB_0061f7af;
      iVar8 = pVVar4->pArray[lVar6];
      if (((long)iVar8 < 0) || (p->nObjs <= iVar8)) goto LAB_0061f790;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar1 = p->pObjs + iVar8;
      Gia_FlaConvertToGla_rec(p,pGVar1 + -(ulong)((uint)*(undefined8 *)pGVar1 & 0x1fffffff),pVVar2);
      lVar6 = lVar6 + 1;
      pVVar4 = p->vCos;
      uVar7 = (ulong)pVVar4->nSize;
    } while (lVar6 < (long)(uVar7 - (long)p->nRegs));
  }
  uVar7 = (ulong)(uint)p->nRegs;
  if (0 < p->nRegs) {
    lVar6 = 0;
    do {
      iVar8 = p->vCos->nSize;
      uVar7 = (ulong)(uint)(iVar8 - (int)uVar7) + lVar6;
      iVar5 = (int)uVar7;
      if ((iVar5 < 0) || (iVar8 <= iVar5)) {
LAB_0061f7af:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar8 = p->vCos->pArray[uVar7 & 0xffffffff];
      if (((long)iVar8 < 0) || (p->nObjs <= iVar8)) {
LAB_0061f790:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) {
        return pVVar2;
      }
      if (vFla->nSize <= lVar6) goto LAB_0061f7af;
      if (vFla->pArray[lVar6] != 0) {
        pGVar1 = p->pObjs + iVar8;
        Gia_FlaConvertToGla_rec
                  (p,pGVar1 + -(ulong)((uint)*(undefined8 *)pGVar1 & 0x1fffffff),pVVar2);
      }
      lVar6 = lVar6 + 1;
      uVar7 = (ulong)p->nRegs;
    } while (lVar6 < (long)uVar7);
  }
  return pVVar2;
}

Assistant:

Vec_Int_t * Gia_FlaConvertToGla( Gia_Man_t * p, Vec_Int_t * vFla )
{
    Vec_Int_t * vGla;
    Gia_Obj_t * pObj;
    int i;
    // mark const0 and relevant CI objects
    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrent(p, Gia_ManConst0(p));
    Gia_ManForEachPi( p, pObj, i )
        Gia_ObjSetTravIdCurrent(p, pObj);
    Gia_ManForEachRo( p, pObj, i )
        if ( !Vec_IntEntry(vFla, i) )
            Gia_ObjSetTravIdCurrent(p, pObj);
    // label all objects reachable from the PO and selected flops
    vGla = Vec_IntStart( Gia_ManObjNum(p) );
    Vec_IntWriteEntry( vGla, 0, 1 );
    Gia_ManForEachPo( p, pObj, i )
        Gia_FlaConvertToGla_rec( p, Gia_ObjFanin0(pObj), vGla );
    Gia_ManForEachRi( p, pObj, i )
        if ( Vec_IntEntry(vFla, i) )
            Gia_FlaConvertToGla_rec( p, Gia_ObjFanin0(pObj), vGla );
    return vGla;
}